

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O2

void __thiscall
Js::InterpreterStackFrame::TrySetFrameObjectInHeapArgObj
          (InterpreterStackFrame *this,ScriptContext *scriptContext,bool hasNonSimpleParams,
          bool isScopeObjRestored)

{
  uint uVar1;
  HeapArgumentsObject *pHVar2;
  code *pcVar3;
  bool bVar4;
  undefined4 *puVar5;
  undefined8 uVar6;
  ActivationObject *value;
  JavascriptFunction *funcCallee;
  char useCachedScope;
  char16_t *form;
  HeapArgumentsObject *this_00;
  uint32 formalsCount;
  Type local_60;
  Type literalType;
  PropertyIdArray *local_40;
  
  pHVar2 = *(HeapArgumentsObject **)(this + 0x40);
  this_00 = (HeapArgumentsObject *)0x0;
  if ((pHVar2 != (HeapArgumentsObject *)0x0) &&
     ((pHVar2->frameObject).ptr == (ActivationObject *)0x0)) {
    this_00 = pHVar2;
  }
  formalsCount = ((*(FunctionBody **)(this + 0x88))->super_ParseableFunctionInfo).m_inParamCount - 1
  ;
  literalType.ptr = (DynamicType *)scriptContext;
  bVar4 = FunctionBody::NeedScopeObjectForArguments
                    (*(FunctionBody **)(this + 0x88),hasNonSimpleParams);
  if (bVar4) {
    value = *(ActivationObject **)(this + 0x58);
    useCachedScope = (*(FunctionBody **)(this + 0x88))->hasCachedScopePropIds;
    local_40 = FunctionBody::GetFormalsPropIdArray(*(FunctionBody **)(this + 0x88),true);
    if ((isScopeObjRestored) && (bVar4 = VarIs<Js::ActivationObject>(value), bVar4)) {
      if ((*(byte *)(*(long *)(this + 0x88) + 0x46) & 0x40) == 0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar5 = 1;
        bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InterpreterStackFrame.cpp"
                                    ,0x2516,"(this->GetFunctionBody()->GetDoScopeObjectCreation())",
                                    "this->GetFunctionBody()->GetDoScopeObjectCreation()");
        if (!bVar4) goto LAB_0095771c;
        *puVar5 = 0;
      }
      bVar4 = Phases::IsEnabled((Phases *)&DAT_01453738,StackArgFormalsOptPhase);
      useCachedScope = true;
      if (((bVar4) && (DAT_0145948a == '\x01')) && (1 < *(ushort *)(*(long **)(this + 0x88) + 10)))
      {
        uVar6 = (**(code **)(**(long **)(this + 0x88) + 0x38))();
        uVar1 = *(uint *)(*(long *)(this + 0x88) + 0x40);
        form = 
        L"StackArgFormals : %s (%d) :Using the restored scope object in the bail out path. \n";
LAB_009575e2:
        Output::Print(form,uVar6,(ulong)uVar1);
        Output::Flush();
      }
    }
    else {
      if ((Type)useCachedScope == false) {
        value = (ActivationObject *)
                JavascriptOperators::OP_NewScopeObject(*(ScriptContext **)(this + 0x78));
        if (local_40 == (PropertyIdArray *)0x0) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
          *puVar5 = 1;
          bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InterpreterStackFrame.cpp"
                                      ,0x252a,"(propIds != nullptr)","propIds != nullptr");
          if (!bVar4) goto LAB_0095771c;
          *puVar5 = 0;
        }
      }
      else {
        local_60.ptr = (DynamicType *)0x0;
        if ((hasNonSimpleParams | local_40->hasNonSimpleParams) == 1) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
          *puVar5 = 1;
          bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InterpreterStackFrame.cpp"
                                      ,0x2523,
                                      "(!propIds->hasNonSimpleParams && !hasNonSimpleParams)",
                                      "!propIds->hasNonSimpleParams && !hasNonSimpleParams");
          if (!bVar4) goto LAB_0095771c;
          *puVar5 = 0;
        }
        value = (ActivationObject *)
                JavascriptOperators::OP_InitCachedScope
                          (*(Var *)(this + 0x80),local_40,&local_60,hasNonSimpleParams,
                           (ScriptContext *)literalType.ptr);
      }
      *(ActivationObject **)(this + 0x58) = value;
      bVar4 = Phases::IsEnabled((Phases *)&DAT_01453738,StackArgFormalsOptPhase);
      if (((bVar4) && (DAT_0145948a == '\x01')) && (1 < *(ushort *)(*(long **)(this + 0x88) + 10)))
      {
        uVar6 = (**(code **)(**(long **)(this + 0x88) + 0x38))();
        uVar1 = *(uint *)(*(long *)(this + 0x88) + 0x40);
        form = L"StackArgFormals : %s (%d) :Creating scope object in the bail out path. \n";
        goto LAB_009575e2;
      }
    }
  }
  else {
    if ((formalsCount != 0) &&
       (((hasNonSimpleParams | *(byte *)(*(long *)(this + 0x88) + 0x46)) & 1) == 0)) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar5 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InterpreterStackFrame.cpp"
                                  ,0x2537,
                                  "(formalsCount == 0 || (m_functionBody->GetIsStrictMode() || hasNonSimpleParams))"
                                  ,
                                  "formalsCount == 0 || (m_functionBody->GetIsStrictMode() || hasNonSimpleParams)"
                                 );
      if (!bVar4) goto LAB_0095771c;
      *puVar5 = 0;
    }
    bVar4 = Phases::IsEnabled((Phases *)&DAT_01453738,StackArgOptPhase);
    if ((bVar4) && (DAT_0145948a == '\x01')) {
      uVar6 = (**(code **)(**(long **)(this + 0x88) + 0x38))();
      Output::Print(L"StackArgOpt : %s (%d) :Creating NULL scope object in the bail out path. \n",
                    uVar6,(ulong)*(uint *)(*(long *)(this + 0x88) + 0x40));
      Output::Flush();
    }
    value = (ActivationObject *)0x0;
    formalsCount = 0;
    local_40 = (PropertyIdArray *)0x0;
    useCachedScope = false;
  }
  if (this_00 != (HeapArgumentsObject *)0x0) {
    if ((value != (ActivationObject *)0x0) && (bVar4 = VarIs<Js::ActivationObject>(value), !bVar4))
    {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar5 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InterpreterStackFrame.cpp"
                                  ,0x2544,
                                  "(frameObject == nullptr || VarIs<ActivationObject>(frameObject))"
                                  ,"frameObject == nullptr || VarIs<ActivationObject>(frameObject)")
      ;
      if (!bVar4) {
LAB_0095771c:
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      *puVar5 = 0;
    }
    this_00->formalCount = formalsCount;
    HeapArgumentsObject::SetFrameObject(this_00,value);
    bVar4 = Phases::IsEnabled((Phases *)&DAT_01453738,StackArgFormalsOptPhase);
    if ((bVar4) && (formalsCount != 0)) {
      uVar6 = (**(code **)(**(long **)(this + 0x88) + 0x38))();
      Output::Print(L"StackArgFormals : %s (%d) :Attaching the scope object with the heap arguments object in the bail out path. \n"
                    ,uVar6,(ulong)*(uint *)(*(long *)(this + 0x88) + 0x40));
      Output::Flush();
    }
  }
  funcCallee = (JavascriptFunction *)(**(code **)(**(long **)(this + 0x80) + 0x3d0))();
  JavascriptOperators::FillScopeObject
            (funcCallee,*(int *)(this + 0x18) - 1,formalsCount,value,
             (Var *)(*(long *)(this + 0x20) + 8),local_40,this_00,(ScriptContext *)literalType.ptr,
             hasNonSimpleParams,(bool)useCachedScope);
  return;
}

Assistant:

void InterpreterStackFrame::TrySetFrameObjectInHeapArgObj(ScriptContext * scriptContext, bool hasNonSimpleParams, bool isScopeObjRestored)
    {
        Var frameObject = nullptr;

        uint32 formalsCount = this->m_functionBody->GetInParamsCount() - 1;
        Js::PropertyIdArray * propIds = nullptr;
        Js::HeapArgumentsObject* heapArgObj = nullptr;

        //We always set the Frame object to nullptr in BailOutRecord::EnsureArguments for stack args optimization.
        if (m_arguments != nullptr && ((Js::HeapArgumentsObject*)(m_arguments))->GetFrameObject() == nullptr)
        {
            heapArgObj = (Js::HeapArgumentsObject*)m_arguments;
        }

        bool isCachedScope = false;

        //For Non-simple params, we don't have a scope object created.
        if (this->m_functionBody->NeedScopeObjectForArguments(hasNonSimpleParams))
        {
            frameObject = GetLocalClosure();

            isCachedScope = m_functionBody->HasCachedScopePropIds();
            propIds = this->m_functionBody->GetFormalsPropIdArray();

            if (isScopeObjRestored && VarIs<ActivationObject>(frameObject))
            {
                Assert(this->GetFunctionBody()->GetDoScopeObjectCreation());
                isCachedScope = true;
                if (PHASE_VERBOSE_TRACE1(Js::StackArgFormalsOptPhase) && m_functionBody->GetInParamsCount() > 1)
                {
                    Output::Print(_u("StackArgFormals : %s (%d) :Using the restored scope object in the bail out path. \n"), m_functionBody->GetDisplayName(), m_functionBody->GetFunctionNumber());
                    Output::Flush();
                }
            }
            else
            {
                if (isCachedScope)
                {
                    Field(DynamicType*) literalType = nullptr;
                    Assert(!propIds->hasNonSimpleParams && !hasNonSimpleParams);
                    frameObject = JavascriptOperators::OP_InitCachedScope(this->GetJavascriptFunction(), propIds, &literalType, hasNonSimpleParams, scriptContext);
                }
                else
                {
                    frameObject = JavascriptOperators::OP_NewScopeObject(GetScriptContext());
                }
                Assert(propIds != nullptr);
                SetLocalClosure(frameObject);

                if (PHASE_VERBOSE_TRACE1(Js::StackArgFormalsOptPhase) && m_functionBody->GetInParamsCount() > 1)
                {
                    Output::Print(_u("StackArgFormals : %s (%d) :Creating scope object in the bail out path. \n"), m_functionBody->GetDisplayName(), m_functionBody->GetFunctionNumber());
                    Output::Flush();
                }
            }
        }
        else
        {
            //We reached here because, either we don't have any formals or we don't have a scope object (it could be in strict mode or have non-simple param list)
            Assert(formalsCount == 0 || (m_functionBody->GetIsStrictMode() || hasNonSimpleParams));
            frameObject = nullptr;
            formalsCount = 0;

            if (PHASE_VERBOSE_TRACE1(Js::StackArgOptPhase))
            {
                Output::Print(_u("StackArgOpt : %s (%d) :Creating NULL scope object in the bail out path. \n"), m_functionBody->GetDisplayName(), m_functionBody->GetFunctionNumber());
                Output::Flush();
            }
        }

        if (heapArgObj)
        {
            Assert(frameObject == nullptr || VarIs<ActivationObject>(frameObject));
            heapArgObj->SetFormalCount(formalsCount);
            heapArgObj->SetFrameObject(frameObject != nullptr ?
                static_cast<ActivationObject*>(frameObject) : nullptr);

            if (PHASE_TRACE1(Js::StackArgFormalsOptPhase) && formalsCount > 0)
            {
                Output::Print(_u("StackArgFormals : %s (%d) :Attaching the scope object with the heap arguments object in the bail out path. \n"), m_functionBody->GetDisplayName(), m_functionBody->GetFunctionNumber());
                Output::Flush();
            }
        }

        //Fill the Heap arguments and scope object with values
        // If there is no heap arguments object, then fill only the scope object with actuals.
        JavascriptOperators::FillScopeObject(this->function->GetRealFunctionObject(), this->m_inSlotsCount - 1, formalsCount, frameObject, &this->m_inParams[1], propIds, heapArgObj, scriptContext, hasNonSimpleParams, isCachedScope);
    }